

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_bsel_v_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)wd;
  uVar1 = (env->active_fpu).fpr[ws].fd;
  (env->active_fpu).fpr[uVar2].fd =
       ((env->active_fpu).fpr[wt].fd ^ uVar1) & (env->active_fpu).fpr[uVar2].fd ^ uVar1;
  uVar1 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  *(ulong *)((long)(env->active_fpu).fpr + uVar2 * 0x10 + 8) =
       (*(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) ^ uVar1) &
       *(ulong *)((long)(env->active_fpu).fpr + uVar2 * 0x10 + 8) ^ uVar1;
  return;
}

Assistant:

void helper_msa_bsel_v(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0] = UNSIGNED(                                                     \
        (pws->d[0] & (~pwd->d[0])) | (pwt->d[0] & pwd->d[0]), DF_DOUBLE);
    pwd->d[1] = UNSIGNED(                                                     \
        (pws->d[1] & (~pwd->d[1])) | (pwt->d[1] & pwd->d[1]), DF_DOUBLE);
}